

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::anon_unknown_0::FullErrorString
                   (string *__return_storage_ptr__,string *name,int line_num,string *msg)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *psVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  string *local_c0 [2];
  string local_b0;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  char *local_60;
  long local_58;
  char local_50 [32];
  
  local_c0[0] = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"error: ","");
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_c0,(ulong)(name->_M_dataplus)._M_p)
  ;
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_90 = *plVar7;
    lStack_88 = plVar3[3];
    local_b0.field_2._M_allocated_capacity = (size_type)&local_90;
  }
  else {
    local_90 = *plVar7;
    local_b0.field_2._M_allocated_capacity = (size_type)(long *)*plVar3;
  }
  local_b0.field_2._8_8_ = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_b0.field_2._M_local_buf);
  puVar8 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar8) {
    local_f0 = *puVar8;
    lStack_e8 = plVar3[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar8;
    local_100 = (ulong *)*plVar3;
  }
  local_f8 = plVar3[1];
  *plVar3 = (long)puVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_60 = local_50;
  pcVar4 = FastInt32ToBufferLeft(line_num,local_50);
  local_58 = (long)pcVar4 - (long)local_50;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,local_60,local_60 + local_58);
  uVar10 = 0xf;
  if (local_100 != &local_f0) {
    uVar10 = local_f0;
  }
  if (uVar10 < (ulong)(local_d8 + local_f8)) {
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if ((ulong)(local_d8 + local_f8) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
      goto LAB_002710fa;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_e0);
LAB_002710fa:
  local_120 = &local_110;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_110 = *puVar1;
    uStack_108 = puVar5[3];
  }
  else {
    local_110 = *puVar1;
    local_120 = (undefined8 *)*puVar5;
  }
  local_118 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_70 = *plVar7;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar7;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)(msg->_M_dataplus)._M_p)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar9) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar9;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((long *)local_b0.field_2._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_b0.field_2._M_allocated_capacity);
  }
  psVar6 = &local_b0;
  if (local_c0[0] != psVar6) {
    operator_delete(local_c0[0]);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

std::string FullErrorString(const std::string& name, int line_num, const std::string& msg) {
  return std::string("error: ") + name + " Line " + StrCat(line_num) + ", " + msg;
}